

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeStamp::~MoleculeStamp(MoleculeStamp *this)

{
  DataHolder *in_RDI;
  vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *unaff_retaddr;
  
  ((ParameterBase *)&in_RDI->_vptr_DataHolder)->_vptr_ParameterBase =
       (_func_int **)&PTR__MoleculeStamp_00525668;
  Utils::deletePointers<std::vector<OpenMD::AtomStamp*,std::allocator<OpenMD::AtomStamp*>>>
            (unaff_retaddr);
  Utils::deletePointers<std::vector<OpenMD::BondStamp*,std::allocator<OpenMD::BondStamp*>>>
            ((vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_> *)unaff_retaddr);
  Utils::deletePointers<std::vector<OpenMD::BendStamp*,std::allocator<OpenMD::BendStamp*>>>
            ((vector<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_> *)unaff_retaddr);
  Utils::deletePointers<std::vector<OpenMD::TorsionStamp*,std::allocator<OpenMD::TorsionStamp*>>>
            ((vector<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_> *)
             unaff_retaddr);
  Utils::
  deletePointers<std::vector<OpenMD::InversionStamp*,std::allocator<OpenMD::InversionStamp*>>>
            ((vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_> *)
             unaff_retaddr);
  Utils::
  deletePointers<std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>>
            ((vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_> *)
             unaff_retaddr);
  Utils::
  deletePointers<std::vector<OpenMD::CutoffGroupStamp*,std::allocator<OpenMD::CutoffGroupStamp*>>>
            ((vector<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_> *)
             unaff_retaddr);
  Utils::deletePointers<std::vector<OpenMD::FragmentStamp*,std::allocator<OpenMD::FragmentStamp*>>>
            ((vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *)
             unaff_retaddr);
  Utils::
  deletePointers<std::vector<OpenMD::ConstraintStamp*,std::allocator<OpenMD::ConstraintStamp*>>>
            ((vector<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_> *)
             unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>::~vector
            ((vector<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_> *)
             unaff_retaddr);
  std::vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::~vector
            ((vector<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_> *)
             unaff_retaddr);
  std::vector<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>::~vector
            ((vector<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_> *)
             unaff_retaddr);
  std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::~vector
            ((vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_> *)
             unaff_retaddr);
  std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>::~vector
            ((vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_> *)
             unaff_retaddr);
  std::vector<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>::~vector
            ((vector<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_> *)
             unaff_retaddr);
  std::vector<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>::~vector
            ((vector<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_> *)unaff_retaddr);
  std::vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>::~vector
            ((vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::~vector(unaff_retaddr);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x37fdff);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI);
  DataHolder::~DataHolder(in_RDI);
  return;
}

Assistant:

MoleculeStamp::~MoleculeStamp() {
    Utils::deletePointers(atomStamps_);
    Utils::deletePointers(bondStamps_);
    Utils::deletePointers(bendStamps_);
    Utils::deletePointers(torsionStamps_);
    Utils::deletePointers(inversionStamps_);
    Utils::deletePointers(rigidBodyStamps_);
    Utils::deletePointers(cutoffGroupStamps_);
    Utils::deletePointers(fragmentStamps_);
    Utils::deletePointers(constraintStamps_);
  }